

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

ssize_t __thiscall xmrig::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  long lVar1;
  uint uVar2;
  SocketState SVar3;
  int iVar4;
  ulong uVar5;
  uint64_t uVar6;
  undefined4 in_register_00000034;
  undefined1 *puVar7;
  uv_buf_t buf;
  undefined1 local_28 [16];
  void *local_18;
  Client *local_10;
  
  local_18 = (void *)CONCAT44(in_register_00000034,__fd);
  local_10 = this;
  uVar2 = (*(this->super_BaseClient).super_IClient._vptr_IClient[5])();
  if ((uVar2 & 1) == 0) {
    SVar3 = state(this);
    if ((SVar3 != ConnectedState) || (iVar4 = uv_is_writable(this->m_stream), iVar4 == 0)) {
      return -1;
    }
    local_28 = uv_buf_init(this->m_sendBuf,(ulong)local_18 & 0xffffffff);
    puVar7 = local_28;
    iVar4 = uv_try_write(this->m_stream,puVar7,1);
    if (iVar4 < 0) {
      close(this,(int)puVar7);
      return -1;
    }
  }
  else {
    uVar5 = Tls::send(this->m_tls,(int)this + 0x280,local_18,__n,__flags);
    if ((uVar5 & 1) == 0) {
      return -1;
    }
  }
  uVar6 = Chrono::steadyMSecs();
  this->m_expire = uVar6 + 20000;
  lVar1 = BaseClient::m_sequence;
  BaseClient::m_sequence = BaseClient::m_sequence + 1;
  return lVar1;
}

Assistant:

int64_t xmrig::Client::send(size_t size)
{
    LOG_DEBUG("[%s] send (%d bytes): \"%.*s\"", url(), size, static_cast<int>(size) - 1, m_sendBuf);

#   ifdef XMRIG_FEATURE_TLS
    if (isTLS()) {
        if (!m_tls->send(m_sendBuf, size)) {
            return -1;
        }
    }
    else
#   endif
    {
        if (state() != ConnectedState || !uv_is_writable(m_stream)) {
            LOG_DEBUG_ERR("[%s] send failed, invalid state: %d", url(), m_state);
            return -1;
        }

        uv_buf_t buf = uv_buf_init(m_sendBuf, (unsigned int) size);

        if (uv_try_write(m_stream, &buf, 1) < 0) {
            close();
            return -1;
        }
    }

    m_expire = Chrono::steadyMSecs() + kResponseTimeout;
    return m_sequence++;
}